

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateBins
          (BamStandardIndex *this,uint32_t *begin,uint32_t *end,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins)

{
  uint uVar1;
  uint uVar2;
  unsigned_short local_3c;
  unsigned_short local_3a;
  unsigned_short local_38;
  unsigned_short local_36;
  unsigned_short local_34 [2];
  
  local_34[1] = 0;
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,local_34 + 1);
  uVar2 = *begin;
  uVar1 = *end;
  if (uVar2 >> 0x1a <= uVar1 >> 0x1a) {
    uVar2 = (uVar2 >> 0x1a) - 1;
    do {
      local_34[0] = (short)uVar2 + 2;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,local_34);
      uVar1 = *end;
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1 >> 0x1a);
    uVar2 = *begin;
  }
  if (uVar2 >> 0x17 <= uVar1 >> 0x17) {
    uVar2 = (uVar2 >> 0x17) + 8;
    do {
      uVar2 = uVar2 + 1;
      local_36 = (unsigned_short)uVar2;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_36);
      uVar1 = *end;
    } while (uVar2 < (uVar1 >> 0x17) + 9);
    uVar2 = *begin;
  }
  if (uVar2 >> 0x14 <= uVar1 >> 0x14) {
    uVar2 = (uVar2 >> 0x14) + 0x48;
    do {
      uVar2 = uVar2 + 1;
      local_38 = (unsigned_short)uVar2;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_38);
      uVar1 = *end;
    } while (uVar2 < (uVar1 >> 0x14) + 0x49);
    uVar2 = *begin;
  }
  if (uVar2 >> 0x11 <= uVar1 >> 0x11) {
    uVar2 = (uVar2 >> 0x11) + 0x248;
    do {
      uVar2 = uVar2 + 1;
      local_3a = (unsigned_short)uVar2;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_3a);
      uVar1 = *end;
    } while (uVar2 < (uVar1 >> 0x11) + 0x249);
    uVar2 = *begin;
  }
  if (uVar2 >> 0xe <= uVar1 >> 0xe) {
    uVar2 = (uVar2 >> 0xe) + 0x1248;
    do {
      uVar2 = uVar2 + 1;
      local_3c = (unsigned_short)uVar2;
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_3c);
    } while (uVar2 < (*end >> 0xe) + 0x1249);
  }
  return;
}

Assistant:

void BamStandardIndex::CalculateCandidateBins(const uint32_t& begin,
                                              const uint32_t& end,
                                              set<uint16_t>& candidateBins)
{
    // initialize list, bin '0' is always a valid bin
    candidateBins.insert(0);

    // get rest of bins that contain this region
    unsigned int k;
    for (k =    1 + (begin>>26); k <=    1 + (end>>26); ++k) { candidateBins.insert(k); }
    for (k =    9 + (begin>>23); k <=    9 + (end>>23); ++k) { candidateBins.insert(k); }
    for (k =   73 + (begin>>20); k <=   73 + (end>>20); ++k) { candidateBins.insert(k); }
    for (k =  585 + (begin>>17); k <=  585 + (end>>17); ++k) { candidateBins.insert(k); }
    for (k = 4681 + (begin>>14); k <= 4681 + (end>>14); ++k) { candidateBins.insert(k); }
}